

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this)

{
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pstd::pmr::polymorphic_allocator<float>::deallocate_object<float>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x401dfc);
  return;
}

Assistant:

~InlinedVector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }